

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# classarray.h
# Opt level: O1

void __thiscall
soplex::
ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
::ClassArray(ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             *this,int p_size,int p_max,double p_fac)

{
  undefined8 *puVar1;
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pNVar2;
  int iVar3;
  long lVar4;
  long lVar5;
  int n;
  
  this->_vptr_ClassArray = (_func_int **)&PTR__ClassArray_006b0a30;
  this->data = (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *)0x0;
  this->memFactor = p_fac;
  iVar3 = 0;
  if (0 < p_size) {
    iVar3 = p_size;
  }
  this->thesize = iVar3;
  n = 1;
  if (0 < p_size) {
    n = iVar3;
  }
  if (iVar3 < p_max) {
    n = p_max;
  }
  this->themax = n;
  spx_alloc<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>*>
            (&this->data,n);
  if (0 < this->themax) {
    lVar4 = 0x50;
    lVar5 = 0;
    do {
      pNVar2 = this->data;
      *(undefined8 *)((long)(pNVar2->val).m_backend.data._M_elems + lVar4 + -8) = 0x1000000000;
      puVar1 = (undefined8 *)((long)(&pNVar2->val + -1) + lVar4);
      *puVar1 = 0;
      puVar1[1] = 0;
      puVar1 = (undefined8 *)((long)(&(pNVar2->val).m_backend.data + -1) + lVar4);
      *puVar1 = 0;
      puVar1[1] = 0;
      puVar1 = (undefined8 *)((long)(pNVar2->val).m_backend.data._M_elems + lVar4 + -0x30);
      *puVar1 = 0;
      puVar1[1] = 0;
      puVar1 = (undefined8 *)((long)(pNVar2->val).m_backend.data._M_elems + lVar4 + -0x20);
      *puVar1 = 0;
      puVar1[1] = 0;
      *(undefined8 *)((long)(pNVar2->val).m_backend.data._M_elems + lVar4 + -0x13) = 0;
      *(undefined4 *)((long)(pNVar2->val).m_backend.data._M_elems + lVar4) = 0;
      lVar5 = lVar5 + 1;
      lVar4 = lVar4 + 0x54;
    } while (lVar5 < this->themax);
  }
  return;
}

Assistant:

explicit ClassArray(int p_size = 0, int p_max = 0, double p_fac = 1.2)
      : data(nullptr)
      , memFactor(p_fac)
   {
      thesize = (p_size < 0) ? 0 : p_size;

      if(p_max > thesize)
         themax = p_max;
      else
         themax = (thesize == 0) ? 1 : thesize;

      spx_alloc(data, max());

      /* call default constructor for each element */
      for(int i = 0; i < max(); i++)
         new(&(data[i])) T();

      assert(isConsistent());
   }